

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O2

int __thiscall chrono::collision::ChCollisionModelBullet::BuildModel(ChCollisionModelBullet *this)

{
  ChContactable *pCVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  __shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  pCVar1 = (this->super_ChCollisionModel).mcontactable;
  if (pCVar1 != (ChContactable *)0x0) {
    iVar3 = (*pCVar1->_vptr_ChContactable[0xf])();
    if (CONCAT44(extraout_var,iVar3) != 0) {
      iVar3 = (*((this->super_ChCollisionModel).mcontactable)->_vptr_ChContactable[0xf])();
      if (*(long *)(CONCAT44(extraout_var_00,iVar3) + 0x38) != 0) {
        iVar3 = (*((this->super_ChCollisionModel).mcontactable)->_vptr_ChContactable[0xf])();
        cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x50))
                          ((long *)CONCAT44(extraout_var_01,iVar3));
        if (cVar2 != '\0') {
          iVar3 = (*((this->super_ChCollisionModel).mcontactable)->_vptr_ChContactable[0xf])();
          std::__shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr(&local_20,
                       (__shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                        *)(*(long *)(CONCAT44(extraout_var_02,iVar3) + 0x38) + 0x248));
          (*(local_20._M_ptr)->_vptr_ChCollisionSystem[4])(local_20._M_ptr,this);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
        }
      }
    }
  }
  return 1;
}

Assistant:

int ChCollisionModelBullet::BuildModel() {
    // Insert model into collision system, if applicable.
    if (mcontactable &&                                 //
        mcontactable->GetPhysicsItem() &&               //
        mcontactable->GetPhysicsItem()->GetSystem() &&  //
        mcontactable->GetPhysicsItem()->GetCollide()    //
    )
        mcontactable->GetPhysicsItem()->GetSystem()->GetCollisionSystem()->Add(this);

    return 1;
}